

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddCompileDefinition(cmMakefile *this,string *option)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"COMPILE_DEFINITIONS",&local_39);
  AppendProperty(this,&local_38,option,false);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::AddCompileDefinition(std::string const& option)
{
  this->AppendProperty("COMPILE_DEFINITIONS", option);
}